

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  unsigned_short *puVar6;
  int *piVar7;
  uint *puVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uchar *puVar15;
  ulong uVar16;
  size_t sVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uchar *puVar21;
  uint uVar22;
  uchar *puVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  size_t left_1;
  uchar *puVar27;
  ulong uVar28;
  uint uVar29;
  size_t left;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  uint local_c4;
  ulong local_b8;
  ulong local_60;
  
  uVar11 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar11 = windowsize;
  }
  uVar18 = 0x40;
  if (0x1fff < windowsize) {
    uVar18 = 0x102;
  }
  local_c4 = 0x3c;
  if (0xffff7fff < windowsize - 0x8001) {
    uVar12 = windowsize - 1;
    local_c4 = 0x5a;
    if ((windowsize & uVar12) == 0) {
      uVar22 = 0x102;
      if (nicematch < 0x102) {
        uVar22 = nicematch;
      }
      local_c4 = 0;
      if (inpos < insize) {
        puVar15 = in + insize;
        local_60 = 0;
        uVar10 = 0;
        bVar9 = false;
        uVar25 = 0;
        local_c4 = 0;
        do {
          uVar13 = getHash(in,insize,inpos);
          uVar28 = 0;
          if (uVar13 == 0) {
            if (uVar25 == 0) {
              puVar23 = in + inpos + 0x102;
              if (puVar15 < in + inpos + 0x102) {
                puVar23 = puVar15;
              }
              for (puVar21 = in + inpos; (puVar21 != puVar23 && (*puVar21 == '\0'));
                  puVar21 = puVar21 + 1) {
              }
              uVar28 = (ulong)(uint)((int)puVar21 - (int)(in + inpos));
            }
            else {
              if ((insize < uVar25 + inpos) || (in[(uVar25 + inpos) - 1] != '\0')) {
                uVar25 = uVar25 - 1;
              }
              uVar28 = (ulong)uVar25;
            }
          }
          uVar25 = (uint)uVar28;
          uVar26 = (uint)inpos & uVar12;
          uVar16 = (ulong)uVar26;
          piVar4 = hash->val;
          piVar4[uVar16] = uVar13;
          piVar5 = hash->head;
          if (piVar5[uVar13] != -1) {
            hash->chain[uVar16] = (unsigned_short)piVar5[uVar13];
          }
          piVar5[uVar13] = uVar26;
          puVar6 = hash->zeros;
          puVar6[uVar16] = (unsigned_short)uVar28;
          piVar7 = hash->headz;
          if (piVar7[uVar28 & 0xffff] != -1) {
            hash->chainz[uVar16] = (unsigned_short)piVar7[uVar28 & 0xffff];
          }
          uVar31 = inpos + 0x102;
          if (insize <= inpos + 0x102) {
            uVar31 = insize;
          }
          piVar7[uVar28 & 0xffff] = uVar26;
          if (uVar11 == 0) {
            local_b8 = 0;
            uVar26 = 0;
          }
          else {
            puVar23 = in + inpos;
            uVar26 = 0;
            local_b8 = 0;
            uVar19 = 0;
            uVar20 = (ulong)hash->chain[uVar16];
            uVar14 = 1;
            do {
              uVar24 = 0;
              if (uVar16 < uVar20) {
                uVar24 = (ulong)windowsize;
              }
              uVar24 = (uVar16 - uVar20) + uVar24;
              if ((uint)uVar24 < (uint)uVar19) break;
              if (uVar24 != 0) {
                puVar27 = in + (inpos - (uVar24 & 0xffffffff));
                puVar21 = puVar23;
                if (2 < uVar25) {
                  uVar19 = (ulong)(uint)puVar6[uVar20];
                  if (uVar25 < puVar6[uVar20]) {
                    uVar19 = uVar28;
                  }
                  puVar27 = puVar27 + uVar19;
                  puVar21 = puVar23 + uVar19;
                }
                for (; (puVar21 != in + uVar31 && (*puVar27 == *puVar21)); puVar27 = puVar27 + 1) {
                  puVar21 = puVar21 + 1;
                }
                uVar29 = (int)puVar21 - (int)puVar23;
                if ((uVar26 < uVar29) &&
                   (local_b8 = uVar24 & 0xffffffff, uVar26 = uVar29, uVar22 <= uVar29)) {
                  local_b8 = uVar24 & 0xffffffff;
                  break;
                }
              }
              uVar2 = hash->chain[uVar20];
              uVar30 = (ulong)uVar2;
              if ((ushort)uVar20 == uVar2) break;
              if ((uVar25 < 3) || (uVar26 <= uVar25)) {
                if (piVar4[uVar2] != uVar13) break;
              }
              else {
                uVar30 = (ulong)hash->chainz[uVar20];
                if (uVar25 != puVar6[uVar30]) break;
              }
              bVar32 = uVar14 != uVar11;
              uVar19 = uVar24;
              uVar20 = uVar30;
              uVar14 = uVar14 + 1;
            } while (bVar32);
          }
          if (lazymatching == 0) goto LAB_0012488c;
          if (((bVar9) || (uVar26 < 3)) || (uVar18 < uVar26 || 0x101 < uVar26)) {
            if (bVar9) {
              if (inpos != 0) {
                if (uVar10 + 1 < uVar26) {
                  bVar1 = in[inpos - 1];
                  uVar13 = uivector_resize(out,out->size + 1);
                  if (uVar13 == 0) {
                    bVar9 = false;
                    local_c4 = 0x53;
                    bVar32 = false;
                    goto LAB_00124bd8;
                  }
                  out->data[out->size - 1] = (uint)bVar1;
                  bVar9 = false;
                }
                else {
                  piVar5[uVar13] = -1;
                  piVar7[uVar28] = -1;
                  inpos = inpos - 1;
                  bVar9 = false;
                  local_b8._0_4_ = (uint)local_60;
                  uVar26 = uVar10;
                }
                goto LAB_0012488c;
              }
              bVar9 = false;
              local_c4 = 0x51;
              inpos = 0;
              bVar32 = false;
            }
            else {
              bVar9 = false;
LAB_0012488c:
              if ((uVar26 < 3) || ((uint)local_b8 <= windowsize)) {
                if (((2 < uVar26) && (minmatch <= uVar26)) &&
                   ((uVar26 != 3 || ((uint)local_b8 < 0x1001)))) {
                  uVar16 = 0x1c;
                  uVar31 = 1;
                  do {
                    uVar19 = uVar16 + uVar31 >> 1;
                    if (LENGTHBASE[uVar19] < uVar26) {
                      uVar31 = uVar19 + 1;
                    }
                    else {
                      uVar16 = uVar19 - 1;
                    }
                  } while (uVar31 <= uVar16);
                  if ((0x1c < uVar31) || (uVar26 < LENGTHBASE[uVar31])) {
                    uVar31 = uVar31 - 1;
                  }
                  uVar25 = LENGTHBASE[uVar31 & 0xffffffff];
                  uVar16 = 0x1d;
                  uVar19 = 1;
                  do {
                    uVar20 = uVar16 + uVar19 >> 1;
                    if (DISTANCEBASE[uVar20] < (uint)local_b8) {
                      uVar19 = uVar20 + 1;
                    }
                    else {
                      uVar16 = uVar20 - 1;
                    }
                  } while (uVar19 <= uVar16);
                  if ((0x1d < uVar19) || ((uint)local_b8 < DISTANCEBASE[uVar19])) {
                    uVar19 = uVar19 - 1;
                  }
                  uVar13 = DISTANCEBASE[uVar19 & 0xffffffff];
                  sVar17 = out->size;
                  uVar14 = uivector_resize(out,sVar17 + 4);
                  if (uVar14 != 0) {
                    puVar8 = out->data;
                    puVar8[sVar17] = (int)uVar31 + 0x101;
                    puVar8[sVar17 + 1] = uVar26 - uVar25;
                    puVar8[sVar17 + 2] = (uint)uVar19;
                    puVar8[sVar17 + 3] = (uint)local_b8 - uVar13;
                  }
                  piVar4 = hash->head;
                  piVar5 = hash->val;
                  puVar6 = hash->zeros;
                  piVar7 = hash->headz;
                  if (uVar26 < 3) {
                    uVar26 = 2;
                  }
                  uVar13 = 1;
                  sVar17 = inpos;
                  do {
                    inpos = sVar17 + 1;
                    uVar14 = getHash(in,insize,inpos);
                    uVar16 = 0;
                    if (uVar14 == 0) {
                      if ((int)uVar28 == 0) {
                        puVar23 = in + sVar17 + 0x103;
                        if (puVar15 < in + sVar17 + 0x103) {
                          puVar23 = puVar15;
                        }
                        for (puVar21 = in + inpos; (puVar21 != puVar23 && (*puVar21 == '\0'));
                            puVar21 = puVar21 + 1) {
                        }
                        uVar16 = (ulong)(uint)((int)puVar21 - (int)(in + inpos));
                      }
                      else if ((insize < uVar28 + inpos) ||
                              (uVar16 = uVar28, in[uVar28 + sVar17] != '\0')) {
                        uVar16 = (ulong)((int)uVar28 - 1);
                      }
                    }
                    uVar25 = (uint)uVar16;
                    uVar29 = (uint)inpos & uVar12;
                    piVar5[uVar29] = uVar14;
                    iVar3 = piVar4[uVar14];
                    if (iVar3 != -1) {
                      hash->chain[uVar29] = (unsigned_short)iVar3;
                    }
                    piVar4[uVar14] = uVar29;
                    puVar6[uVar29] = (unsigned_short)uVar16;
                    iVar3 = piVar7[uVar16 & 0xffff];
                    if (iVar3 != -1) {
                      hash->chainz[uVar29] = (unsigned_short)iVar3;
                    }
                    piVar7[uVar16 & 0xffff] = uVar29;
                    uVar13 = uVar13 + 1;
                    sVar17 = inpos;
                    uVar28 = uVar16;
                  } while (uVar13 != uVar26);
                  goto LAB_00124bd3;
                }
                bVar1 = in[inpos];
                uVar13 = uivector_resize(out,out->size + 1);
                if (uVar13 == 0) {
                  local_c4 = 0x53;
                }
                else {
                  out->data[out->size - 1] = (uint)bVar1;
                }
                bVar32 = uVar13 != 0;
              }
              else {
                bVar32 = false;
                local_c4 = 0x56;
              }
            }
          }
          else {
            bVar9 = true;
            local_60 = local_b8;
            uVar10 = uVar26;
LAB_00124bd3:
            bVar32 = true;
          }
LAB_00124bd8:
        } while ((bVar32) && (inpos = inpos + 1, inpos < insize));
      }
    }
  }
  return local_c4;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching) {
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8u;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos) {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0) {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    } else {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;) {
      if(chainlength++ >= maxchainlength) break;
      current_offset = (unsigned)(hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize);

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0) {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3) {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/ {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length) {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros) {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      } else {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching) {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH) {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy) {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1) {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        } else {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/ {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    } else if(length < minmatch || (length == 3 && offset > 4096)) {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    } else {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i) {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0) {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        } else {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}